

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O1

tommy_trie_node *
trie_bucket_remove_existing
          (tommy_trie *trie,tommy_uint_t shift,tommy_trie_node **let_ptr,tommy_trie_node *remove,
          tommy_key_t key)

{
  code **ppcVar1;
  tommy_trie_node *ptVar2;
  tommy_allocator *ptVar3;
  bool bVar4;
  ulong uVar5;
  byte bVar6;
  tommy_trie_node *ptVar7;
  tommy_node_struct *ptVar8;
  tommy_allocator_entry_struct *ptVar9;
  undefined4 in_register_00000034;
  tommy_node_struct *ptVar10;
  ulong uVar11;
  tommy_node *head;
  tommy_trie_node *ptVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  tommy_trie_node **let_back [10];
  code *apcStack_60 [11];
  long local_8;
  
  ptVar10 = (tommy_node_struct *)CONCAT44(in_register_00000034,shift);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar12 = ptVar10->next;
  if (ptVar12 != (tommy_trie_node *)0x0) {
    bVar6 = 0x1b;
    uVar5 = 0;
    do {
      if (((ulong)ptVar12 & 1) == 0) {
        if ((let_ptr != (tommy_trie_node **)0x0) ||
           (let_ptr = &ptVar12->next, ptVar12->key == (uint)remove)) {
          ptVar2 = ((tommy_trie_node *)let_ptr)->next;
          ptVar7 = ptVar2;
          if (ptVar2 == (tommy_trie_node *)0x0) {
            ptVar7 = ptVar12;
          }
          ptVar7->prev = ((tommy_trie_node *)let_ptr)->prev;
          ptVar8 = ptVar10;
          if (ptVar12 != (tommy_trie_node *)let_ptr) {
            ptVar8 = ((tommy_trie_node *)let_ptr)->prev;
          }
          ptVar8->next = ptVar2;
          if ((int)uVar5 != 0 && ptVar10->next == (tommy_node_struct *)0x0) {
            do {
              ppcVar1 = apcStack_60 + uVar5;
              uVar5 = uVar5 - 1;
              ptVar9 = (tommy_allocator_entry_struct *)(*(long *)*ppcVar1 + -1);
              uVar11 = 0;
              uVar13 = 0;
              bVar4 = false;
              do {
                if (ptVar9[uVar11].next != (tommy_allocator_entry_struct *)0x0) {
                  if ((((ulong)ptVar9[uVar11].next & 1) != 0) || (bVar4)) goto LAB_0011055d;
                  bVar4 = true;
                  uVar13 = uVar11 & 0xffffffff;
                }
                uVar11 = uVar11 + 1;
              } while (uVar11 != 8);
              if (!bVar4) {
                apcStack_60[0] = tommy_trie_remove_existing;
                __assert_fail("count == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/third-party/tommyds/tommytrie.c"
                              ,0xee,
                              "tommy_trie_node *trie_bucket_remove_existing(tommy_trie *, tommy_uint_t, tommy_trie_node **, tommy_trie_node *, tommy_key_t)"
                             );
              }
              *(tommy_allocator_entry_struct **)*ppcVar1 = ptVar9[uVar13].next;
              ptVar3 = trie->alloc;
              ptVar9->next = ptVar3->free_block;
              ptVar3->free_block = ptVar9;
              ptVar3->count = ptVar3->count - 1;
              trie->node_count = trie->node_count - 1;
            } while (uVar5 != 0);
          }
          goto LAB_0011055d;
        }
        break;
      }
      apcStack_60[uVar5 + 1] = (code *)ptVar10;
      ptVar10 = (tommy_node_struct *)
                ((long)ptVar12 + (ulong)((uint)remove >> (bVar6 & 0x1f) & 7) * 8 + -1);
      bVar6 = bVar6 - 3;
      ptVar12 = ptVar10->next;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (ptVar12 != (tommy_trie_node *)0x0);
  }
  let_ptr = (tommy_trie_node **)0x0;
LAB_0011055d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    apcStack_60[0] = (code *)0x11063f;
    __stack_chk_fail();
  }
  return (tommy_trie_node *)let_ptr;
}

Assistant:

static tommy_trie_node* trie_bucket_remove_existing(tommy_trie* trie, tommy_uint_t shift, tommy_trie_node** let_ptr, tommy_trie_node* remove, tommy_key_t key)
{
	tommy_trie_node* node;
	tommy_trie_tree* tree;
	void* ptr;
	tommy_trie_node** let_back[TOMMY_TRIE_LEVEL_MAX + 1];
	tommy_uint_t level;
	tommy_uint_t i;
	tommy_uint_t count;
	tommy_uint_t last;

	level = 0;
recurse:
	ptr = *let_ptr;

	if (!ptr)
		return 0;

	if (trie_get_type(ptr) == TOMMY_TRIE_TYPE_TREE) {
		tree = trie_get_tree(ptr);

		/* save the path */
		let_back[level++] = let_ptr;

		/* go down one level */
		let_ptr = &tree->map[(key >> shift) & TOMMY_TRIE_TREE_MASK];
		shift -= TOMMY_TRIE_TREE_BIT;

		goto recurse;
	}

	node = tommy_cast(tommy_trie_node*, ptr);

	/* if the node to remove is not specified */
	if (!remove) {
		/* remove the first */
		remove = node;

		/* check if it's really the element to remove */
		if (remove->key != key)
			return 0;
	}

	tommy_list_remove_existing(let_ptr, remove);

	/* if the list is not empty, try to reduce */
	if (*let_ptr || !level)
		return remove;

reduce:
	/* go one level up */
	let_ptr = let_back[--level];

	tree = trie_get_tree(*let_ptr);

	/* check if there is only one child node */
	count = 0;
	last = 0;
	for (i = 0; i < TOMMY_TRIE_TREE_MAX; ++i) {
		if (tree->map[i]) {
			/* if we have a sub tree, we cannot reduce */
			if (trie_get_type(tree->map[i]) != TOMMY_TRIE_TYPE_NODE)
				return remove;
			/* if more than one node, we cannot reduce */
			if (++count > 1)
				return remove;
			last = i;
		}
	}

	/* here count is never 0, as we cannot have a tree with only one sub node */
	assert(count == 1);

	*let_ptr = tree->map[last];

	tommy_allocator_free(trie->alloc, tree);
	--trie->node_count;

	/* repeat until more level */
	if (level)
		goto reduce;

	return remove;
}